

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldInterpolatorTests.cpp
# Opt level: O1

void __thiscall
FieldInterpolatorTest_Constructor_Test::TestBody(FieldInterpolatorTest_Constructor_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vector3<double> b;
  Vector3<double> e;
  YeeGrid<(pica::Dimension)1,_double> grid;
  YeeGrid<(pica::Dimension)2,_double> grid2;
  YeeGrid<(pica::Dimension)3,_double> grid3;
  PositionType local_478;
  PositionType local_458;
  IndexType local_434;
  undefined1 local_428 [24];
  PositionType local_410;
  Vector3<double> local_408;
  Vector3<double> local_3e8;
  Grid<(pica::Dimension)1,_double> local_3d0;
  Grid<(pica::Dimension)2,_double> local_2e8;
  undefined1 local_1a8 [408];
  
  local_1a8._0_8_ = -1.5;
  local_2e8.exData.size.x = 0;
  local_2e8.exData.size.y = 0x3fe00000;
  local_428._0_4_ = 10;
  pica::Grid<(pica::Dimension)1,_double>::Grid
            (&local_3d0,(PositionType *)local_1a8,(PositionType *)&local_2e8,(IndexType *)local_428)
  ;
  auVar2._8_8_ = local_3d0.origin.x;
  auVar2._0_8_ = 0x3ff0000000000000;
  auVar1._8_8_ = local_3d0.step.x;
  auVar1._0_8_ = local_3d0.step.x;
  local_428._8_16_ = divpd(auVar2,auVar1);
  local_410.x = local_428._16_8_ + 0.5;
  local_3e8.z = 0.0;
  local_3e8.x = 0.0;
  local_3e8.y = 0.0;
  local_408.z = 0.0;
  local_408.x = 0.0;
  local_408.y = 0.0;
  local_428._0_8_ = &local_3d0;
  pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_>::get
            ((FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_> *)local_428,
             (PositionType)0x3ff0000000000000,&local_3e8,&local_408);
  local_1a8._0_8_ = 1.0;
  local_1a8._8_8_ = 1.0;
  local_458.x = 2.0;
  local_458.y = 2.0;
  local_478.x = 1.06099789563086e-313;
  pica::Grid<(pica::Dimension)2,_double>::Grid
            (&local_2e8,(PositionType *)local_1a8,(PositionType *)&local_458,(IndexType *)&local_478
            );
  local_458.x = 1.0;
  local_458.y = 1.0;
  local_458.z = 1.0;
  local_478.x = 2.0;
  local_478.y = 2.0;
  local_478.z = 2.0;
  local_434.x = 3;
  local_434.y = 5;
  local_434.z = 7;
  pica::Grid<(pica::Dimension)3,_double>::Grid
            ((Grid<(pica::Dimension)3,_double> *)local_1a8,&local_458,&local_478,&local_434);
  pica::Grid<(pica::Dimension)3,_double>::~Grid((Grid<(pica::Dimension)3,_double> *)local_1a8);
  pica::Grid<(pica::Dimension)2,_double>::~Grid(&local_2e8);
  pica::Grid<(pica::Dimension)1,_double>::~Grid(&local_3d0);
  return;
}

Assistant:

TEST(FieldInterpolatorTest, Constructor)
{
    double origin = -1.5;
    double step = 0.5;
    int size = 10;
    YeeGrid<One, double> grid(origin, step, size);
    FieldInterpolatorCIC<YeeGrid<One, double> > interpolator(grid);
    Vector3<double> e, b;
    interpolator.get(1.0, e, b);

    YeeGrid<Two, double> grid2(Vector2<double>(1.0, 1.0), Vector2<double>(2.0, 2.0), Vector2<int>(3, 5));
    FieldInterpolatorCIC<YeeGrid<Two, double> > interpolator2(grid2);

    YeeGrid<Three, double> grid3(Vector3<double>(1.0, 1.0, 1.0), Vector3<double>(2.0, 2.0, 2.0), Vector3<int>(3, 5, 7));
    FieldInterpolatorCIC<YeeGrid<Three, double> > interpolator3(grid3);
}